

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

ExternalValueExpr * __thiscall
SQCompilation::CheckerVisitor::findExternalValue(CheckerVisitor *this,Expr *e)

{
  bool bVar1;
  TreeOp TVar2;
  SQChar *pSVar3;
  ValueRef *this_00;
  Expr *in_RDI;
  Expr *expr;
  ValueRef *v;
  SQChar *name;
  SQChar buffer [128];
  Expr *ee;
  CheckerVisitor *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff50;
  SQChar *in_stack_ffffffffffffff58;
  Expr *in_stack_ffffffffffffff60;
  CheckerVisitor *in_stack_ffffffffffffff68;
  ExternalValueExpr *local_8;
  
  local_8 = (ExternalValueExpr *)maybeEval(in_stack_ffffffffffffff40,in_RDI,false);
  TVar2 = Node::op((Node *)local_8);
  if (TVar2 != TO_EXTERNAL_VALUE) {
    memset(&stack0xffffffffffffff58,0,0x80);
    pSVar3 = computeNameRef(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if (pSVar3 == (SQChar *)0x0) {
      local_8 = (ExternalValueExpr *)0x0;
    }
    else {
      this_00 = findValueInScopes(in_stack_ffffffffffffff68,(SQChar *)in_stack_ffffffffffffff60);
      if ((this_00 == (ValueRef *)0x0) || (bVar1 = ValueRef::hasValue(this_00), !bVar1)) {
        local_8 = (ExternalValueExpr *)0x0;
      }
      else {
        local_8 = (ExternalValueExpr *)maybeEval(in_stack_ffffffffffffff40,in_RDI,false);
        TVar2 = Node::op((Node *)local_8);
        if (TVar2 != TO_EXTERNAL_VALUE) {
          local_8 = (ExternalValueExpr *)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

const ExternalValueExpr *CheckerVisitor::findExternalValue(const Expr *e) {
  const Expr *ee = maybeEval(e, true);

  if (ee->op() == TO_EXTERNAL_VALUE)
    return static_cast<const ExternalValueExpr *>(ee);

  SQChar buffer[128] = { 0 };
  const SQChar *name = computeNameRef(ee, buffer, sizeof buffer);
  if (!name)
    return nullptr;

  const ValueRef *v = findValueInScopes(name);

  if (!v || !v->hasValue())
    return nullptr;

  const Expr *expr = maybeEval(v->expression, true);

  if (expr->op() == TO_EXTERNAL_VALUE)
    return static_cast<const ExternalValueExpr *>(expr);

  return nullptr;
}